

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int coda_get_product_file_size(coda_product *product,int64_t *file_size)

{
  int64_t *file_size_local;
  coda_product *product_local;
  
  if (product == (coda_product *)0x0) {
    coda_set_error(-100,"product file argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x369);
    product_local._4_4_ = -1;
  }
  else if (file_size == (int64_t *)0x0) {
    coda_set_error(-100,"file_size argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x36e);
    product_local._4_4_ = -1;
  }
  else {
    *file_size = product->file_size;
    product_local._4_4_ = 0;
  }
  return product_local._4_4_;
}

Assistant:

LIBCODA_API int coda_get_product_file_size(const coda_product *product, int64_t *file_size)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (file_size == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "file_size argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *file_size = product->file_size;

    return 0;
}